

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.h
# Opt level: O3

void __thiscall Resources::Resources(Resources *this,path *project_root)

{
  _Rb_tree_header *p_Var1;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->project_root_,project_root);
  this->shader_include_guard_ = 0;
  p_Var1 = &(this->shader_sources_)._M_t._M_impl.super__Rb_tree_header;
  (this->shader_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->shader_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->shader_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->shader_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->shader_sources_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textures_)._M_t._M_impl.super__Rb_tree_header;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Resources(const fs::path &project_root) : project_root_(project_root) {}